

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLElement::QueryBoolText(XMLElement *this,bool *bval)

{
  bool bVar1;
  int iVar2;
  XMLNode *pXVar3;
  undefined4 extraout_var;
  bool *value;
  char *in_RSI;
  XMLNode *in_RDI;
  char *t;
  
  pXVar3 = XMLNode::FirstChild(in_RDI);
  if (pXVar3 != (XMLNode *)0x0) {
    pXVar3 = XMLNode::FirstChild(in_RDI);
    iVar2 = (*pXVar3->_vptr_XMLNode[7])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      XMLNode::FirstChild(in_RDI);
      value = (bool *)XMLNode::Value(in_RDI);
      bVar1 = XMLUtil::ToBool(in_RSI,value);
      if (!bVar1) {
        return XML_CAN_NOT_CONVERT_TEXT;
      }
      return XML_NO_ERROR;
    }
  }
  return XML_NO_TEXT_NODE;
}

Assistant:

XMLError XMLElement::QueryBoolText( bool* bval ) const
{
    if ( FirstChild() && FirstChild()->ToText() ) {
        const char* t = FirstChild()->Value();
        if ( XMLUtil::ToBool( t, bval ) ) {
            return XML_SUCCESS;
        }
        return XML_CAN_NOT_CONVERT_TEXT;
    }
    return XML_NO_TEXT_NODE;
}